

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity.c
# Opt level: O1

char * unittest_read(char *path,size_t *size,uint32_t *fileid,void *xdata,_Bool *is_static)

{
  _Bool _Var1;
  char *pcVar2;
  char *pcVar3;
  
  if (is_static != (_Bool *)0x0) {
    *is_static = false;
  }
  _Var1 = file_exists(path);
  if (_Var1) {
    pcVar2 = file_read(path,size);
    return pcVar2;
  }
  pcVar2 = file_buildpath(path,test_folder_path);
  if (pcVar2 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = file_read(pcVar2,size);
    free(pcVar2);
  }
  return pcVar3;
}

Assistant:

static const char *unittest_read (const char *path, size_t *size, uint32_t *fileid, void *xdata, bool *is_static) {
    (void) fileid, (void) xdata;
    if (is_static) *is_static = false;
    
    if (file_exists(path)) return file_read(path, size);
    
    // this unittest is able to resolve path only next to main test folder (not in nested folders)
    const char *newpath = file_buildpath(path, test_folder_path);
    if (!newpath) return NULL;
    
    const char *buffer = file_read(newpath, size);
    mem_free(newpath);
    
    return buffer;
}